

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O3

void __thiscall QLineEditPrivate::positionSideWidgets(QLineEditPrivate *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  pointer pSVar5;
  char cVar6;
  LayoutDirection LVar7;
  SideWidgetEntryList *pSVar8;
  Representation RVar9;
  SideWidgetEntry *e;
  pointer pSVar10;
  int iVar11;
  Representation RVar12;
  SideWidgetEntry *e_1;
  long in_FS_OFFSET;
  SideWidgetParameters SVar13;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->leadingSideWidgets).
       super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (this->leadingSideWidgets).
       super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     ((this->trailingSideWidgets).
      super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->trailingSideWidgets).
      super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    lVar4 = *(long *)(*(long *)&(this->super_QWidgetPrivate).field_0x8 + 0x20);
    iVar1 = *(int *)(lVar4 + 0x1c);
    iVar2 = *(int *)(lVar4 + 0x14);
    iVar11 = *(int *)(lVar4 + 0x18);
    iVar3 = *(int *)(lVar4 + 0x20);
    SVar13 = sideWidgetParameters(this);
    iVar11 = iVar11 + SVar13.widgetHeight;
    local_48.y1.m_i = ((iVar3 - iVar11) - ((iVar3 - iVar11) + 1 >> 0x1f)) + 1 >> 1;
    local_48.y2.m_i = SVar13.widgetHeight + local_48.y1.m_i + -1;
    RVar12.m_i = SVar13.margin;
    iVar11 = RVar12.m_i + SVar13.widgetWidth;
    RVar9.m_i = RVar12.m_i + SVar13.widgetWidth + -1;
    local_48.x1.m_i = RVar12.m_i;
    local_48.x2.m_i = RVar9.m_i;
    LVar7 = QWidget::layoutDirection(*(QWidget **)&(this->super_QWidgetPrivate).field_0x8);
    pSVar8 = &this->trailingSideWidgets;
    if (LVar7 == LeftToRight) {
      pSVar8 = &this->leadingSideWidgets;
    }
    pSVar10 = (pSVar8->
              super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pSVar5 = (pSVar8->
             super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar10 != pSVar5) {
      do {
        QWidget::setGeometry(pSVar10->widget,&local_48);
        cVar6 = QAction::isVisible();
        if (cVar6 != '\0') {
          local_48.x2.m_i = local_48.x2.m_i + iVar11;
          local_48.x1.m_i = local_48.x1.m_i + iVar11;
        }
        pSVar10 = pSVar10 + 1;
        RVar9.m_i = local_48.x2.m_i;
        RVar12.m_i = local_48.x1.m_i;
      } while (pSVar10 != pSVar5);
    }
    local_48.x1.m_i = (iVar1 - (iVar2 + iVar11)) + 1;
    local_48.x2.m_i = (local_48.x1.m_i - RVar12.m_i) + RVar9.m_i;
    LVar7 = QWidget::layoutDirection(*(QWidget **)&(this->super_QWidgetPrivate).field_0x8);
    pSVar8 = &this->leadingSideWidgets;
    if (LVar7 == LeftToRight) {
      pSVar8 = &this->trailingSideWidgets;
    }
    pSVar10 = (pSVar8->
              super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pSVar5 = (pSVar8->
             super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar10 != pSVar5) {
      do {
        QWidget::setGeometry(pSVar10->widget,&local_48);
        cVar6 = QAction::isVisible();
        if (cVar6 != '\0') {
          local_48.x2.m_i = local_48.x2.m_i - iVar11;
          local_48.x1.m_i = local_48.x1.m_i - iVar11;
        }
        pSVar10 = pSVar10 + 1;
      } while (pSVar10 != pSVar5);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLineEditPrivate::positionSideWidgets()
{
    Q_Q(QLineEdit);
    if (hasSideWidgets()) {
        const QRect contentRect = q->rect();
        const SideWidgetParameters p = sideWidgetParameters();
        const int delta = p.margin + p.widgetWidth;
        QRect widgetGeometry(QPoint(p.margin, (contentRect.height() - p.widgetHeight) / 2),
                             QSize(p.widgetWidth, p.widgetHeight));
        for (const SideWidgetEntry &e : leftSideWidgetList()) {
            e.widget->setGeometry(widgetGeometry);
#if QT_CONFIG(action)
            if (e.action->isVisible())
                widgetGeometry.moveLeft(widgetGeometry.left() + delta);
#else
            Q_UNUSED(delta);
#endif
        }
        widgetGeometry.moveLeft(contentRect.width() - p.widgetWidth - p.margin);
        for (const SideWidgetEntry &e : rightSideWidgetList()) {
            e.widget->setGeometry(widgetGeometry);
#if QT_CONFIG(action)
            if (e.action->isVisible())
                widgetGeometry.moveLeft(widgetGeometry.left() - delta);
#endif
        }
    }
}